

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_class.cpp
# Opt level: O3

void Omega_h::classify_by_angles(Mesh *mesh,Real sharp_angle)

{
  int *piVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  uint uVar3;
  Alloc *pAVar4;
  Alloc *pAVar5;
  LO LVar6;
  undefined8 uVar7;
  long lVar8;
  char *pcVar9;
  int iVar10;
  ulong uVar11;
  char *pcVar12;
  LOs surf_hinge2hinge;
  Read<signed_char> side_is_exposed;
  Write<signed_char> hinge_is_sharp;
  LOs surf_side2side;
  Read<signed_char> hinge_is_exposed;
  Reals surf_side_normals;
  Reals surf_hinge_angles;
  LOs side2surf_side;
  type f;
  Alloc *local_230;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_228;
  Alloc *local_220;
  pointer local_218;
  Write<signed_char> local_210;
  Alloc *local_200;
  void *local_1f8;
  Omega_h *local_1f0;
  Omega_h *local_1e8;
  LOs local_1e0;
  Alloc *local_1d0;
  void *local_1c8;
  undefined1 local_1c0 [32];
  Alloc *local_1a0;
  element_type *local_198;
  Real local_190;
  Write<signed_char> local_188;
  Read<signed_char> local_178;
  Alloc *local_168;
  LO local_160 [2];
  LOs local_158;
  Read<signed_char> local_148;
  LOs local_138;
  Alloc *local_128;
  void *local_120;
  Read<signed_char> local_118;
  Read<signed_char> local_108;
  Alloc *local_f8;
  element_type *local_f0;
  LOs local_e8;
  Alloc *local_d8;
  LO local_d0 [2];
  Read<signed_char> local_c8;
  Read<signed_char> local_b8;
  Alloc *local_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_a0;
  Alloc *local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_90;
  Alloc *local_88;
  element_type *peStack_80;
  pointer local_78;
  Alloc *local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  Alloc *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  Alloc *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  element_type *local_38;
  
  if (mesh->family_ == OMEGA_H_SIMPLEX) {
    uVar3 = mesh->dim_;
    if (uVar3 < 4) {
      classify_elements(mesh);
      mark_exposed_sides((Omega_h *)&local_220,mesh);
      local_b8.write_.shared_alloc_.alloc = local_220;
      if (((ulong)local_220 & 7) == 0 && local_220 != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_b8.write_.shared_alloc_.alloc = (Alloc *)(local_220->size * 8 + 1);
        }
        else {
          local_220->use_count = local_220->use_count + 1;
        }
      }
      pAVar4 = local_b8.write_.shared_alloc_.alloc;
      local_b8.write_.shared_alloc_.direct_ptr = local_218;
      classify_sides_by_exposure(mesh,&local_b8);
      if (((ulong)pAVar4 & 7) == 0 && pAVar4 != (Alloc *)0x0) {
        piVar1 = &pAVar4->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(pAVar4);
          operator_delete(pAVar4,0x48);
        }
      }
      if (uVar3 != 1) {
        local_c8.write_.shared_alloc_.alloc = local_220;
        if (((ulong)local_220 & 7) == 0 && local_220 != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_c8.write_.shared_alloc_.alloc = (Alloc *)(local_220->size * 8 + 1);
          }
          else {
            local_220->use_count = local_220->use_count + 1;
          }
        }
        local_c8.write_.shared_alloc_.direct_ptr = local_218;
        mark_down((Omega_h *)&local_1d0,mesh,uVar3 - 1,uVar3 - 2,&local_c8);
        pAVar4 = local_c8.write_.shared_alloc_.alloc;
        if (((ulong)local_c8.write_.shared_alloc_.alloc & 7) == 0 &&
            local_c8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          piVar1 = &(local_c8.write_.shared_alloc_.alloc)->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(local_c8.write_.shared_alloc_.alloc);
            operator_delete(pAVar4,0x48);
          }
        }
        local_118.write_.shared_alloc_.alloc = local_220;
        if (((ulong)local_220 & 7) == 0 && local_220 != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_118.write_.shared_alloc_.alloc = (Alloc *)(local_220->size * 8 + 1);
          }
          else {
            local_220->use_count = local_220->use_count + 1;
          }
        }
        local_118.write_.shared_alloc_.direct_ptr = local_218;
        local_1e8 = (Omega_h *)&local_1d0;
        collect_marked((Omega_h *)&local_200,&local_118);
        pAVar4 = local_118.write_.shared_alloc_.alloc;
        if (((ulong)local_118.write_.shared_alloc_.alloc & 7) == 0 &&
            local_118.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          piVar1 = &(local_118.write_.shared_alloc_.alloc)->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(local_118.write_.shared_alloc_.alloc);
            operator_delete(pAVar4,0x48);
          }
        }
        local_138.write_.shared_alloc_.alloc = local_200;
        if (((ulong)local_200 & 7) == 0 && local_200 != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_138.write_.shared_alloc_.alloc = (Alloc *)(local_200->size * 8 + 1);
          }
          else {
            local_200->use_count = local_200->use_count + 1;
          }
        }
        local_138.write_.shared_alloc_.direct_ptr = local_1f8;
        get_side_vectors((Omega_h *)&local_128,mesh,&local_138);
        pAVar4 = local_138.write_.shared_alloc_.alloc;
        if (((ulong)local_138.write_.shared_alloc_.alloc & 7) == 0 &&
            local_138.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          piVar1 = &(local_138.write_.shared_alloc_.alloc)->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(local_138.write_.shared_alloc_.alloc);
            operator_delete(pAVar4,0x48);
          }
        }
        local_148.write_.shared_alloc_.alloc = local_1d0;
        if (((ulong)local_1d0 & 7) == 0 && local_1d0 != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_148.write_.shared_alloc_.alloc = (Alloc *)(local_1d0->size * 8 + 1);
          }
          else {
            local_1d0->use_count = local_1d0->use_count + 1;
          }
        }
        local_148.write_.shared_alloc_.direct_ptr = local_1c8;
        collect_marked((Omega_h *)&local_230,&local_148);
        pAVar4 = local_148.write_.shared_alloc_.alloc;
        if (((ulong)local_148.write_.shared_alloc_.alloc & 7) == 0 &&
            local_148.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          piVar1 = &(local_148.write_.shared_alloc_.alloc)->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(local_148.write_.shared_alloc_.alloc);
            operator_delete(pAVar4,0x48);
          }
        }
        if (((ulong)local_230 & 1) == 0) {
          uVar11 = local_230->size;
        }
        else {
          uVar11 = (ulong)local_230 >> 3;
        }
        LVar6 = Mesh::nents(mesh,uVar3 - 1);
        local_e8.write_.shared_alloc_.alloc = local_200;
        if (((ulong)local_200 & 7) == 0 && local_200 != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_e8.write_.shared_alloc_.alloc = (Alloc *)(local_200->size * 8 + 1);
          }
          else {
            local_200->use_count = local_200->use_count + 1;
          }
        }
        local_e8.write_.shared_alloc_.direct_ptr = local_1f8;
        invert_injective_map((Omega_h *)&local_d8,&local_e8,LVar6);
        pAVar4 = local_e8.write_.shared_alloc_.alloc;
        if (((ulong)local_e8.write_.shared_alloc_.alloc & 7) == 0 &&
            local_e8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   ((long)local_e8.write_.shared_alloc_.alloc + 0x30);
          *(int *)&p_Var2->_vptr__Sp_counted_base = *(int *)&p_Var2->_vptr__Sp_counted_base + -1;
          if (*(int *)&p_Var2->_vptr__Sp_counted_base == 0) {
            Alloc::~Alloc(local_e8.write_.shared_alloc_.alloc);
            operator_delete(pAVar4,0x48);
          }
        }
        local_158.write_.shared_alloc_.alloc = local_128;
        if (((ulong)local_128 & 7) == 0 && local_128 != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_158.write_.shared_alloc_.alloc = (Alloc *)(local_128->size * 8 + 1);
          }
          else {
            local_128->use_count = local_128->use_count + 1;
          }
        }
        local_158.write_.shared_alloc_.direct_ptr = local_120;
        local_1e0.write_.shared_alloc_.alloc = local_230;
        if (((ulong)local_230 & 7) == 0 && local_230 != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_1e0.write_.shared_alloc_.alloc = (Alloc *)(local_230->size * 8 + 1);
          }
          else {
            local_230->use_count = local_230->use_count + 1;
          }
        }
        local_1e0.write_.shared_alloc_.direct_ptr = local_228;
        local_168 = local_d8;
        if (((ulong)local_d8 & 7) == 0 && local_d8 != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_168 = (Alloc *)(local_d8->size * 8 + 1);
          }
          else {
            local_d8->use_count = local_d8->use_count + 1;
          }
        }
        local_160[0] = local_d0[0];
        local_160[1] = local_d0[1];
        local_1f0 = (Omega_h *)&local_d8;
        get_hinge_angles((Mesh *)&local_f8,(Reals *)mesh,&local_158,&local_1e0);
        pAVar4 = local_168;
        if (((ulong)local_168 & 7) == 0 && local_168 != (Alloc *)0x0) {
          piVar1 = &local_168->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(local_168);
            operator_delete(pAVar4,0x48);
          }
        }
        pAVar4 = local_1e0.write_.shared_alloc_.alloc;
        if (((ulong)local_1e0.write_.shared_alloc_.alloc & 7) == 0 &&
            local_1e0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          piVar1 = &(local_1e0.write_.shared_alloc_.alloc)->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(local_1e0.write_.shared_alloc_.alloc);
            operator_delete(pAVar4,0x48);
          }
        }
        pAVar4 = local_158.write_.shared_alloc_.alloc;
        if (((ulong)local_158.write_.shared_alloc_.alloc & 7) == 0 &&
            local_158.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          piVar1 = &(local_158.write_.shared_alloc_.alloc)->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(local_158.write_.shared_alloc_.alloc);
            operator_delete(pAVar4,0x48);
          }
        }
        LVar6 = Mesh::nents(mesh,uVar3 - 2);
        local_1c0._0_8_ = (Alloc *)(local_1c0 + 0x10);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1c0,"");
        Write<signed_char>::Write(&local_210,LVar6,'\0',(string *)local_1c0);
        if ((Alloc *)local_1c0._0_8_ != (Alloc *)(local_1c0 + 0x10)) {
          operator_delete((void *)local_1c0._0_8_,(ulong)(local_1c0._16_8_ + 1));
        }
        local_68 = local_230;
        if (((ulong)local_230 & 7) == 0 && local_230 != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_68 = (Alloc *)(local_230->size * 8 + 1);
          }
          else {
            local_230->use_count = local_230->use_count + 1;
          }
        }
        local_60._M_pi = local_228;
        local_58 = local_210.shared_alloc_.alloc;
        if (((ulong)local_210.shared_alloc_.alloc & 7) == 0 &&
            local_210.shared_alloc_.alloc != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_58 = (Alloc *)((local_210.shared_alloc_.alloc)->size * 8 + 1);
          }
          else {
            (local_210.shared_alloc_.alloc)->use_count =
                 (local_210.shared_alloc_.alloc)->use_count + 1;
          }
        }
        local_50._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_210.shared_alloc_.direct_ptr;
        local_48 = local_f8;
        if (((ulong)local_f8 & 7) == 0 && local_f8 != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_48 = (Alloc *)(local_f8->size * 8 + 1);
          }
          else {
            local_f8->use_count = local_f8->use_count + 1;
          }
        }
        local_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f0;
        local_a8 = local_68;
        if (((ulong)local_68 & 7) == 0 && local_68 != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_a8 = (Alloc *)(local_68->size * 8 + 1);
          }
          else {
            local_68->use_count = local_68->use_count + 1;
          }
        }
        p_Stack_a0 = local_228;
        local_98 = local_58;
        if (((ulong)local_58 & 7) == 0 && local_58 != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_98 = (Alloc *)(local_58->size * 8 + 1);
          }
          else {
            local_58->use_count = local_58->use_count + 1;
          }
        }
        p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_210.shared_alloc_.direct_ptr;
        local_88 = local_48;
        if (((ulong)local_48 & 7) == 0 && local_48 != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_88 = (Alloc *)(local_48->size * 8 + 1);
          }
          else {
            local_48->use_count = local_48->use_count + 1;
          }
        }
        peStack_80 = local_f0;
        iVar10 = (int)(uVar11 >> 2);
        local_78 = (pointer)sharp_angle;
        local_38 = (element_type *)sharp_angle;
        if (0 < iVar10) {
          local_1c0._8_8_ = local_228;
          local_1c0._0_8_ = local_a8;
          if (((ulong)local_a8 & 7) == 0 && local_a8 != (Alloc *)0x0) {
            local_a8->use_count = local_a8->use_count + -1;
            local_1c0._0_8_ = local_a8->size * 8 + 1;
          }
          local_a8 = (Alloc *)0x0;
          p_Stack_a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_1c0._24_8_ = local_210.shared_alloc_.direct_ptr;
          local_1c0._16_8_ = local_98;
          if (((ulong)local_98 & 7) == 0 && local_98 != (Alloc *)0x0) {
            local_98->use_count = local_98->use_count + -1;
            local_1c0._16_8_ = local_98->size * 8 + 1;
          }
          local_98 = (Alloc *)0x0;
          p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_198 = local_f0;
          local_1a0 = local_88;
          if (((ulong)local_88 & 7) == 0 && local_88 != (Alloc *)0x0) {
            local_88->use_count = local_88->use_count + -1;
            local_1a0 = (Alloc *)(local_88->size * 8 + 1);
          }
          local_88 = (Alloc *)0x0;
          peStack_80 = (element_type *)0x0;
          entering_parallel = '\0';
          lVar8 = 0;
          do {
            *(bool *)((long)&((__shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2> *)
                             local_210.shared_alloc_.direct_ptr)->_M_ptr +
                     (long)*(int *)((long)&((__shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>
                                             *)&local_228->_vptr__Sp_counted_base)->_M_ptr +
                                   lVar8 * 4)) = sharp_angle <= (double)(&local_f0->library_)[lVar8]
            ;
            lVar8 = lVar8 + 1;
          } while (iVar10 != (int)lVar8);
          local_190 = sharp_angle;
          classify_by_angles(Omega_h::Mesh*,double)::$_0::~__0((__0 *)local_1c0);
        }
        classify_by_angles(Omega_h::Mesh*,double)::$_0::~__0((__0 *)&local_a8);
        local_178.write_.shared_alloc_.alloc = local_1d0;
        if (((ulong)local_1d0 & 7) == 0 && local_1d0 != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_178.write_.shared_alloc_.alloc = (Alloc *)(local_1d0->size * 8 + 1);
          }
          else {
            local_1d0->use_count = local_1d0->use_count + 1;
          }
        }
        pAVar4 = local_178.write_.shared_alloc_.alloc;
        local_178.write_.shared_alloc_.direct_ptr = local_1c8;
        local_188.shared_alloc_.alloc = local_210.shared_alloc_.alloc;
        if (((ulong)local_210.shared_alloc_.alloc & 7) == 0 &&
            local_210.shared_alloc_.alloc != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_188.shared_alloc_.alloc = (Alloc *)((local_210.shared_alloc_.alloc)->size * 8 + 1)
            ;
          }
          else {
            (local_210.shared_alloc_.alloc)->use_count =
                 (local_210.shared_alloc_.alloc)->use_count + 1;
          }
        }
        local_188.shared_alloc_.direct_ptr = local_210.shared_alloc_.direct_ptr;
        Read<signed_char>::Read(&local_108,&local_188);
        classify_hinges_by_sharpness(mesh,&local_178,&local_108);
        if (((ulong)local_108.write_.shared_alloc_.alloc & 7) == 0 &&
            local_108.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          piVar1 = &(local_108.write_.shared_alloc_.alloc)->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(local_108.write_.shared_alloc_.alloc);
            operator_delete(local_108.write_.shared_alloc_.alloc,0x48);
          }
        }
        pAVar5 = local_188.shared_alloc_.alloc;
        if (((ulong)local_188.shared_alloc_.alloc & 7) == 0 &&
            local_188.shared_alloc_.alloc != (Alloc *)0x0) {
          piVar1 = &(local_188.shared_alloc_.alloc)->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(local_188.shared_alloc_.alloc);
            operator_delete(pAVar5,0x48);
          }
        }
        if (((ulong)pAVar4 & 7) == 0 && pAVar4 != (Alloc *)0x0) {
          piVar1 = &pAVar4->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(pAVar4);
            operator_delete(pAVar4,0x48);
          }
        }
        if (uVar3 != 2) {
          finalize_classification(mesh);
        }
        classify_by_angles(Omega_h::Mesh*,double)::$_0::~__0((__0 *)&local_68);
        if (((ulong)local_210.shared_alloc_.alloc & 7) == 0 &&
            local_210.shared_alloc_.alloc != (Alloc *)0x0) {
          piVar1 = &(local_210.shared_alloc_.alloc)->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(local_210.shared_alloc_.alloc);
            operator_delete(local_210.shared_alloc_.alloc,0x48);
          }
        }
        if (((ulong)local_f8 & 7) == 0 && local_f8 != (Alloc *)0x0) {
          piVar1 = &local_f8->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(local_f8);
            operator_delete(local_f8,0x48);
          }
        }
        if (((ulong)local_d8 & 7) == 0 && local_d8 != (Alloc *)0x0) {
          piVar1 = &local_d8->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(local_d8);
            operator_delete(local_d8,0x48);
          }
        }
        if (((ulong)local_230 & 7) == 0 && local_230 != (Alloc *)0x0) {
          piVar1 = &local_230->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(local_230);
            operator_delete(local_230,0x48);
          }
        }
        if (((ulong)local_128 & 7) == 0 && local_128 != (Alloc *)0x0) {
          piVar1 = &local_128->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(local_128);
            operator_delete(local_128,0x48);
          }
        }
        if (((ulong)local_200 & 7) == 0 && local_200 != (Alloc *)0x0) {
          piVar1 = &local_200->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(local_200);
            operator_delete(local_200,0x48);
          }
        }
        if (((ulong)local_1d0 & 7) == 0 && local_1d0 != (Alloc *)0x0) {
          piVar1 = &local_1d0->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(local_1d0);
            operator_delete(local_1d0,0x48);
          }
        }
      }
      if (((ulong)local_220 & 7) == 0 && local_220 != (Alloc *)0x0) {
        piVar1 = &local_220->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_220);
          operator_delete(local_220,0x48);
        }
      }
      return;
    }
    pcVar12 = "0 <= dim_ && dim_ <= 3";
    pcVar9 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.hpp"
    ;
    uVar7 = 0x33;
  }
  else {
    pcVar12 = "mesh->family() == OMEGA_H_SIMPLEX";
    pcVar9 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_class.cpp"
    ;
    uVar7 = 0x2b;
  }
  fail("assertion %s failed at %s +%d\n",pcVar12,pcVar9,uVar7);
}

Assistant:

void classify_by_angles(Mesh* mesh, Real sharp_angle) {
  OMEGA_H_CHECK(mesh->family() == OMEGA_H_SIMPLEX);
  auto dim = mesh->dim();
  classify_elements(mesh);
  auto side_is_exposed = mark_exposed_sides(mesh);
  classify_sides_by_exposure(mesh, side_is_exposed);
  if (dim == 1) return;
  auto hinge_is_exposed = mark_down(mesh, dim - 1, dim - 2, side_is_exposed);
  auto surf_side2side = collect_marked(side_is_exposed);
  auto surf_side_normals = get_side_vectors(mesh, surf_side2side);
  auto surf_hinge2hinge = collect_marked(hinge_is_exposed);
  auto nsurf_hinges = surf_hinge2hinge.size();
  auto nsides = mesh->nents(dim - 1);
  auto side2surf_side = invert_injective_map(surf_side2side, nsides);
  auto surf_hinge_angles = get_hinge_angles(
      mesh, surf_side_normals, surf_hinge2hinge, side2surf_side);
  auto nhinges = mesh->nents(dim - 2);
  Write<I8> hinge_is_sharp(nhinges, 0);
  auto f = OMEGA_H_LAMBDA(LO surf_hinge) {
    LO hinge = surf_hinge2hinge[surf_hinge];
    hinge_is_sharp[hinge] = (surf_hinge_angles[surf_hinge] >= sharp_angle);
  };
  parallel_for(nsurf_hinges, f, "classify_by_angles(is_sharp)");
  classify_hinges_by_sharpness(mesh, hinge_is_exposed, hinge_is_sharp);
  if (dim == 2) return;
  finalize_classification(mesh);
}